

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O1

int If_DsdManComputeFirstArray(If_DsdMan_t *p,int *pLits,int nLits,int *pFirsts)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  
  if (nLits < 1) {
    iVar1 = 0;
  }
  else {
    uVar2 = 0;
    iVar1 = 0;
    do {
      pFirsts[uVar2] = iVar1;
      if (pLits[uVar2] < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      uVar3 = (uint)pLits[uVar2] >> 1;
      if ((p->vObjs).nSize <= (int)uVar3) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      iVar1 = iVar1 + (*(uint *)((long)(p->vObjs).pArray[uVar3] + 4) >> 3 & 0x1f);
      uVar2 = uVar2 + 1;
    } while ((uint)nLits != uVar2);
  }
  return iVar1;
}

Assistant:

int If_DsdManComputeFirstArray( If_DsdMan_t * p, int * pLits, int nLits, int * pFirsts )
{
    int i, nSSize = 0;
    for ( i = 0; i < nLits; i++ )
    {
        pFirsts[i] = nSSize;
        nSSize += If_DsdVecLitSuppSize(&p->vObjs, pLits[i]);
    }
    return nSSize;
}